

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZBSpStructMatrix.cpp
# Opt level: O0

TPZStructMatrix * __thiscall
TPZBSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>::Clone
          (TPZBSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
           *this)

{
  TPZStructMatrix *pTVar1;
  TPZBSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_> *in_RDI;
  TPZBSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
  *unaff_retaddr;
  
  pTVar1 = (TPZStructMatrix *)operator_new(0xc0);
  TPZBSpStructMatrix(unaff_retaddr,in_RDI);
  return pTVar1;
}

Assistant:

TPZStructMatrix * TPZBSpStructMatrix<TVar,TPar>::Clone(){
    return new TPZBSpStructMatrix(*this);
}